

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v11::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  size_t sVar6;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  uint uVar7;
  uint uVar8;
  int iVar9;
  bigint *lhs2;
  runtime_error *this;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  bigint *this_00;
  int iVar15;
  long lVar16;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  undefined8 in_stack_fffffffffffffca8;
  undefined4 uVar17;
  undefined4 uVar18;
  bigint local_2f8;
  bigint local_248;
  bigint local_198;
  bigint local_e8;
  
  local_2f8.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f8.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar1 = local_2f8.bigits_.store_;
  local_2f8.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f8.exp_ = 0;
  local_248.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_248.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar2 = local_248.bigits_.store_;
  local_248.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_248.exp_ = 0;
  lhs2 = &local_198;
  local_198.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_198.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar3 = local_198.bigits_.store_;
  local_198.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  uVar17 = (undefined4)((ulong)lhs2 >> 0x20);
  local_198.exp_ = 0;
  this_00 = &local_e8;
  local_e8.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e8.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar4 = local_e8.bigits_.store_;
  local_e8.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e8.exp_ = 0;
  iVar15 = (flags & 1) + 1;
  local_2f8.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_248.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_198.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e8.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f8,-*exp10);
      bigint::assign(&local_198,&local_2f8);
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &local_e8;
        bigint::assign(this_00,&local_2f8);
        bigint::operator<<=(this_00,1);
      }
      value_00._8_4_ = (int)lhs2;
      value_00._0_8_ = in_stack_fffffffffffffca8;
      value_00._12_4_ = (int)((ulong)lhs2 >> 0x20);
      bigint::multiply<unsigned___int128,_0>(&local_2f8,(unsigned___int128)value_00);
      bigint::operator<<=(&local_2f8,iVar15);
      *local_248.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_248.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (*local_248.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_248,1);
      }
      local_248.bigits_.super_buffer<unsigned_int>.size_ =
           (size_t)(local_248.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
      local_248.exp_ = 0;
      bigint::operator<<=(&local_248,iVar15 - value.e);
    }
    else {
      n_00._8_4_ = (int)lhs2;
      n_00._0_8_ = in_stack_fffffffffffffca8;
      n_00._12_4_ = uVar17;
      bigint::assign<unsigned___int128,_0>(&local_2f8,(unsigned___int128)n_00);
      bigint::operator<<=(&local_2f8,iVar15);
      bigint::assign_pow10(&local_248,*exp10);
      bigint::operator<<=(&local_248,iVar15 - value.e);
      *local_198.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_198.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (*local_198.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_198,1);
      }
      local_198.bigits_.super_buffer<unsigned_int>.size_ =
           (size_t)(local_198.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
      local_198.exp_ = 0;
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        *local_e8.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        if (local_e8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (*local_e8.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_e8,1);
        }
        local_e8.bigits_.super_buffer<unsigned_int>.size_ =
             (size_t)(local_e8.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
        local_e8.exp_ = 0;
      }
    }
  }
  else {
    n._8_4_ = (int)lhs2;
    n._0_8_ = in_stack_fffffffffffffca8;
    n._12_4_ = uVar17;
    bigint::assign<unsigned___int128,_0>(&local_2f8,(unsigned___int128)n);
    bigint::operator<<=(&local_2f8,iVar15 + value.e);
    *local_198.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    if (local_198.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (*local_198.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_198,1);
    }
    local_198.bigits_.super_buffer<unsigned_int>.size_ =
         (size_t)(local_198.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
    local_198.exp_ = 0;
    bigint::operator<<=(&local_198,value.e);
    if ((flags & 1) == 0) {
      this_00 = (bigint *)0x0;
    }
    else {
      *local_e8.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_e8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (*local_e8.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_e8,1);
      }
      this_00 = &local_e8;
      local_e8.bigits_.super_buffer<unsigned_int>.size_ =
           (size_t)(local_e8.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
      local_e8.exp_ = 0;
      bigint::operator<<=(this_00,value.e + 1);
    }
    bigint::assign_pow10(&local_248,*exp10);
    bigint::operator<<=(&local_248,iVar15);
  }
  uVar7 = ~(uint)value.f & 1;
  if (this_00 != (bigint *)0x0) {
    lhs2 = this_00;
  }
  uVar17 = SUB84(lhs2,0);
  uVar18 = (undefined4)((ulong)lhs2 >> 0x20);
  uVar14 = num_digits;
  if ((flags & 2) != 0) {
    iVar15 = add_compare(&local_2f8,lhs2,&local_248);
    if (iVar15 + uVar7 == 0 || SCARRY4(iVar15,uVar7) != (int)(iVar15 + uVar7) < 0) {
      *exp10 = *exp10 + -1;
      bigint::multiply(&local_2f8,10);
      if (num_digits < 0) {
        bigint::multiply(&local_198,10);
        if (this_00 != (bigint *)0x0) {
          bigint::multiply((bigint *)CONCAT44(uVar18,uVar17),10);
        }
      }
    }
    if ((flags & 4) != 0) {
      iVar15 = *exp10;
      if (0x7ffffffe - iVar15 < num_digits && -1 < iVar15) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"number is too big");
        *(undefined ***)this = &PTR__runtime_error_0017f850;
        __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar14 = num_digits + iVar15 + 1;
    }
  }
  if (-1 < num_digits) {
    uVar7 = uVar14 - 1;
    *exp10 = *exp10 - uVar7;
    if ((int)uVar14 < 1) {
      bVar10 = 0x30;
      if (uVar14 == 0) {
        bigint::multiply(&local_248,10);
        iVar15 = add_compare(&local_2f8,&local_2f8,&local_248);
        bVar10 = 0 < iVar15 | 0x30;
      }
      uVar12 = buf->size_ + 1;
      if (buf->capacity_ < uVar12) {
        (*buf->grow_)(buf,uVar12);
      }
      sVar6 = buf->size_;
      buf->size_ = sVar6 + 1;
      buf->ptr_[sVar6] = bVar10;
    }
    else {
      uVar12 = (ulong)uVar14;
      if (buf->capacity_ < uVar12) {
        (*buf->grow_)(buf,uVar12);
      }
      uVar13 = buf->capacity_;
      if (uVar12 < buf->capacity_) {
        uVar13 = uVar12;
      }
      buf->size_ = uVar13;
      if (uVar14 != 1) {
        uVar13 = 1;
        if (1 < (int)uVar7) {
          uVar13 = (ulong)uVar7;
        }
        uVar11 = 0;
        do {
          iVar15 = bigint::divmod_assign(&local_2f8,&local_248);
          buf->ptr_[uVar11] = (char)iVar15 + '0';
          bigint::multiply(&local_2f8,10);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      uVar8 = bigint::divmod_assign(&local_2f8,&local_248);
      iVar15 = add_compare(&local_2f8,&local_2f8,&local_248);
      if ((0 < iVar15) || ((uVar8 & 1) != 0 && iVar15 == 0)) {
        if (uVar8 == 9) {
          buf->ptr_[(int)uVar7] = ':';
          if (uVar14 != 1) {
            lVar16 = uVar12 + 1;
            do {
              if (buf->ptr_[lVar16 + -2] != ':') break;
              buf->ptr_[lVar16 + -2] = '0';
              buf->ptr_[lVar16 + -3] = buf->ptr_[lVar16 + -3] + '\x01';
              lVar16 = lVar16 + -1;
            } while (2 < lVar16);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            if ((flags & 4) == 0) {
              *exp10 = *exp10 + 1;
            }
            else {
              uVar12 = buf->size_ + 1;
              if (buf->capacity_ < uVar12) {
                (*buf->grow_)(buf,uVar12);
              }
              sVar6 = buf->size_;
              buf->size_ = sVar6 + 1;
              buf->ptr_[sVar6] = '0';
            }
          }
          goto LAB_00162fbc;
        }
        uVar8 = uVar8 + 1;
      }
      buf->ptr_[(int)uVar7] = (char)uVar8 + '0';
    }
    goto LAB_00162fbc;
  }
  pcVar5 = buf->ptr_;
  lVar16 = 0;
  while( true ) {
    uVar14 = bigint::divmod_assign(&local_2f8,&local_248);
    iVar15 = compare(&local_2f8,&local_198);
    iVar9 = add_compare(&local_2f8,(bigint *)CONCAT44(uVar18,uVar17),&local_248);
    pcVar5[lVar16] = (char)uVar14 + '0';
    if ((iVar15 < (int)uVar7) || ((int)-uVar7 < iVar9)) break;
    bigint::multiply(&local_2f8,10);
    bigint::multiply(&local_198,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply((bigint *)CONCAT44(uVar18,uVar17),10);
    }
    lVar16 = lVar16 + 1;
  }
  if (iVar15 < (int)uVar7) {
    if ((int)-uVar7 < iVar9) {
      iVar15 = add_compare(&local_2f8,&local_2f8,&local_248);
      if ((0 < iVar15) || ((uVar14 & 1) != 0 && iVar15 == 0)) goto LAB_00162f0a;
    }
  }
  else {
LAB_00162f0a:
    pcVar5 = pcVar5 + ((lVar16 + 1U & 0xffffffff) - 1);
    *pcVar5 = *pcVar5 + '\x01';
  }
  uVar12 = lVar16 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar12) {
    (*buf->grow_)(buf,uVar12);
  }
  uVar13 = buf->capacity_;
  if (uVar12 < buf->capacity_) {
    uVar13 = uVar12;
  }
  buf->size_ = uVar13;
  *exp10 = *exp10 - (int)lVar16;
LAB_00162fbc:
  if (local_e8.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    free(local_e8.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_198.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    free(local_198.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_248.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    free(local_248.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_2f8.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    free(local_2f8.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    auto digit = '0';
    if (num_digits == 0) {
      denominator *= 10;
      digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    }
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0)
          buf.push_back('0');
        else
          ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}